

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

Bit32u __thiscall OPL::DOSBox::DBOPL::Chip::ForwardNoise(Chip *this)

{
  uint local_14;
  Bitu count;
  Chip *this_local;
  
  this->noiseCounter = this->noiseAdd + this->noiseCounter;
  local_14 = this->noiseCounter;
  this->noiseCounter = this->noiseCounter & 0x3fffff;
  for (local_14 = local_14 >> 0xc; local_14 != 0; local_14 = local_14 - 1) {
    this->noiseValue = -(this->noiseValue & 1) & 0x800302 ^ this->noiseValue;
    this->noiseValue = this->noiseValue >> 1;
  }
  return this->noiseValue;
}

Assistant:

INLINE Bit32u Chip::ForwardNoise() {
	noiseCounter += noiseAdd;
	Bitu count = noiseCounter >> LFO_SH;
	noiseCounter &= WAVE_MASK;
	for ( ; count > 0; --count ) {
		//Noise calculation from mame
		noiseValue ^= ( 0x800302 ) & ( 0 - (noiseValue & 1 ) );
		noiseValue >>= 1;
	}
	return noiseValue;
}